

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall Potassco::AspifTextInput::matchStr(AspifTextInput *this)

{
  char cVar1;
  BufferedStream *this_00;
  BufferedStream *in_RDI;
  char c;
  bool quoted;
  bool in_stack_0000004f;
  char *in_stack_00000050;
  AspifTextInput *in_stack_00000058;
  char in_stack_ffffffffffffffdf;
  undefined5 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe5;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 uVar2;
  bool local_9;
  
  match(in_stack_00000058,in_stack_00000050,in_stack_0000004f);
  push((AspifTextInput *)
       CONCAT17(in_stack_ffffffffffffffe7,
                CONCAT16(in_stack_ffffffffffffffe6,
                         CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))),
       in_stack_ffffffffffffffdf);
  local_9 = false;
  while( true ) {
    this_00 = ProgramReader::stream((ProgramReader *)in_RDI);
    cVar1 = BufferedStream::peek(this_00);
    uVar2 = false;
    if ((cVar1 != '\0') &&
       (in_stack_ffffffffffffffe6 = true, uVar2 = in_stack_ffffffffffffffe6, cVar1 == '\"')) {
      in_stack_ffffffffffffffe6 = local_9;
      uVar2 = local_9;
    }
    if ((bool)uVar2 == false) break;
    local_9 = local_9 == false && cVar1 == '\\';
    in_stack_ffffffffffffffe5 = local_9;
    ProgramReader::stream((ProgramReader *)in_RDI);
    BufferedStream::get(in_RDI);
    push((AspifTextInput *)
         CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))),
         in_stack_ffffffffffffffdf);
  }
  match(in_stack_00000058,in_stack_00000050,in_stack_0000004f);
  push((AspifTextInput *)
       CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffe6,
                               CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))),
       in_stack_ffffffffffffffdf);
  return;
}

Assistant:

void AspifTextInput::matchStr() {
	match("\""), push('"');
	bool quoted = false;
	for (char c; (c = stream()->peek()) != 0 && (c != '\"' || quoted);) {
		quoted = !quoted && c == '\\';
		push(stream()->get());
	}
	match("\""), push('"');
}